

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::PrintToChar<char16_t>(char16_t value,iu_ostream *os)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  size_t sVar8;
  ostream *poVar9;
  char16_t *str_00;
  undefined6 in_register_0000003a;
  uint uVar11;
  uint uVar12;
  undefined1 auVar10 [16];
  short sVar13;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char16_t str [2];
  uint local_50;
  undefined1 local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar14;
  undefined6 uVar15;
  
  if ((int)CONCAT62(in_register_0000003a,value) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
    return;
  }
  if ((ushort)value < 0x20) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
    auVar17._0_4_ = CONCAT22(0,(ushort)value >> 0xc);
    auVar17._4_2_ = (ushort)value >> 8;
    auVar17._6_2_ = 0;
    auVar17._8_2_ = (ushort)value >> 4;
    auVar17._10_2_ = 0;
    auVar17._12_2_ = value;
    auVar17._14_2_ = 0;
    uVar11 = (ushort)value >> 8 & 0xf;
    uVar12 = (ushort)value >> 4 & 0xf;
    auVar16._0_4_ = -(uint)(9 < auVar17._0_4_);
    auVar16._4_4_ = -(uint)(9 < uVar11);
    auVar16._8_4_ = -(uint)(9 < uVar12);
    auVar16._12_4_ = -(uint)(9 < ((ushort)value & 0xf));
    auVar10._0_4_ = auVar17._0_4_ + 0x37;
    auVar10._4_4_ = uVar11 + 0x37;
    auVar10._8_4_ = uVar12 + 0x37;
    auVar10._12_4_ = ((ushort)value & 0xf) + 0x37;
    auVar17 = (~auVar16 & (auVar17 | _DAT_0014c080) | auVar10 & auVar16) & _DAT_0014c140;
    sVar5 = auVar17._0_2_;
    cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar17[0] - (0xff < sVar5);
    sVar5 = auVar17._2_2_;
    sVar13 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar17[2] - (0xff < sVar5),cVar1);
    sVar5 = auVar17._4_2_;
    cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar17[4] - (0xff < sVar5);
    sVar5 = auVar17._6_2_;
    uVar14 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar17[6] - (0xff < sVar5),
                      CONCAT12(cVar2,sVar13));
    sVar5 = auVar17._8_2_;
    cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar17[8] - (0xff < sVar5);
    sVar5 = auVar17._10_2_;
    uVar15 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar17[10] - (0xff < sVar5),
                      CONCAT14(cVar3,uVar14));
    sVar5 = auVar17._12_2_;
    cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar17[0xc] - (0xff < sVar5);
    sVar7 = auVar17._14_2_;
    sVar5 = (short)((uint)uVar14 >> 0x10);
    sVar6 = (short)((uint6)uVar15 >> 0x20);
    sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar17[0xe] - (0xff < sVar7),
                             CONCAT16(cVar4,uVar15)) >> 0x30);
    local_50 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                 CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                                          (0 < sVar13) * (sVar13 < 0x100) * cVar1 - (0xff < sVar13))
                                ));
    local_4c = 0;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar8 = strlen((char *)&local_50);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,&local_50,(long)&local_50 + sVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return;
    }
  }
  else {
    local_50 = (uint)(ushort)value;
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    CodeConvert<char16_t,char,__mbstate_t>(&local_48,(detail *)&local_50,str_00);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return;
    }
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}